

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::OptionsToInterpret::OptionsToInterpret
          (OptionsToInterpret *this,string *ns,string *el,Message *orig_opt,Message *opt)

{
  Message *opt_local;
  Message *orig_opt_local;
  string *el_local;
  string *ns_local;
  OptionsToInterpret *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)ns);
  std::__cxx11::string::string((string *)&this->element_name,(string *)el);
  this->original_options = orig_opt;
  this->options = opt;
  return;
}

Assistant:

OptionsToInterpret(const string& ns,
                     const string& el,
                     const Message* orig_opt,
                     Message* opt)
      : name_scope(ns),
        element_name(el),
        original_options(orig_opt),
        options(opt) {
  }